

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O2

void __thiscall
QSharedDataPointer<QHstsPolicyPrivate>::detach_helper(QSharedDataPointer<QHstsPolicyPrivate> *this)

{
  QHstsPolicyPrivate *pQVar1;
  int iVar2;
  undefined4 extraout_var;
  int in_ECX;
  void *in_RDX;
  __fn *in_RSI;
  void *in_R8;
  QHstsPolicyPrivate *pQVar3;
  
  iVar2 = clone(this,in_RSI,in_RDX,in_ECX,in_R8);
  pQVar3 = (QHstsPolicyPrivate *)CONCAT44(extraout_var,iVar2);
  LOCK();
  (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  pQVar1 = (this->d).ptr;
  LOCK();
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + -1);
  UNLOCK();
  if ((__int_type)
      (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> == 0) {
    pQVar1 = (this->d).ptr;
    if (pQVar1 != (QHstsPolicyPrivate *)0x0) {
      QHstsPolicyPrivate::~QHstsPolicyPrivate(pQVar1);
    }
    operator_delete(pQVar1,0x20);
  }
  (this->d).ptr = pQVar3;
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QSharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d.get()->ref.deref())
        delete d.get();
    d.reset(x);
}